

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * __thiscall Kvm::makeEnvironment(Kvm *this)

{
  Value *local_18;
  Value *env;
  Kvm *this_local;
  
  local_18 = (Value *)0x0;
  env = (Value *)this;
  Kgc::pushLocalStackRoot(&this->gc_,&local_18);
  local_18 = setupEnvironment(this);
  populateEnvironment(this,local_18);
  Kgc::popLocalStackRoot(&this->gc_);
  return local_18;
}

Assistant:

const Value* Kvm::makeEnvironment()
{
    const Value *env = nullptr;
    gc_.pushLocalStackRoot(&env);
    
    env = setupEnvironment();
    populateEnvironment(const_cast<Value *>(env));
    
    gc_.popLocalStackRoot();
    return env;
}